

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O3

bool __thiscall
pybind11::detail::argument_loader<LongReadsMapper*,unsigned_char,int,int,int,int,int>::
load_impl_sequence<0ul,1ul,2ul,3ul,4ul,5ul,6ul>
          (argument_loader<LongReadsMapper*,unsigned_char,int,int,int,int,int> *this,long call)

{
  char cVar1;
  bool bVar2;
  undefined8 in_RAX;
  long lVar3;
  undefined8 uStack_18;
  
  uStack_18 = in_RAX;
  bVar2 = type_caster_generic::load_impl<pybind11::detail::type_caster_generic>
                    ((type_caster_generic *)(this + 0x18),(PyObject *)**(undefined8 **)(call + 8),
                     (bool)((byte)**(undefined4 **)(call + 0x20) & 1));
  uStack_18._0_2_ = CONCAT11(bVar2,(undefined1)uStack_18);
  bVar2 = type_caster<unsigned_char,_void>::load
                    ((type_caster<unsigned_char,_void> *)(this + 0x14),
                     *(PyObject **)(*(long *)(call + 8) + 8),
                     SUB41((**(uint **)(call + 0x20) & 2) >> 1,0));
  uStack_18._0_3_ = CONCAT12(bVar2,(undefined2)uStack_18);
  bVar2 = type_caster<int,_void>::load
                    ((type_caster<int,_void> *)(this + 0x10),
                     *(PyObject **)(*(long *)(call + 8) + 0x10),
                     SUB41((**(uint **)(call + 0x20) & 4) >> 2,0));
  uStack_18._0_4_ = CONCAT13(bVar2,(undefined3)uStack_18);
  bVar2 = type_caster<int,_void>::load
                    ((type_caster<int,_void> *)(this + 0xc),
                     *(PyObject **)(*(long *)(call + 8) + 0x18),
                     SUB41((**(uint **)(call + 0x20) & 8) >> 3,0));
  uStack_18._0_5_ = CONCAT14(bVar2,(undefined4)uStack_18);
  bVar2 = type_caster<int,_void>::load
                    ((type_caster<int,_void> *)(this + 8),*(PyObject **)(*(long *)(call + 8) + 0x20)
                     ,SUB41((**(uint **)(call + 0x20) & 0x10) >> 4,0));
  uStack_18._0_6_ = CONCAT15(bVar2,(undefined5)uStack_18);
  bVar2 = type_caster<int,_void>::load
                    ((type_caster<int,_void> *)(this + 4),*(PyObject **)(*(long *)(call + 8) + 0x28)
                     ,SUB41((**(uint **)(call + 0x20) & 0x20) >> 5,0));
  uStack_18._0_7_ = CONCAT16(bVar2,(undefined6)uStack_18);
  type_caster<int,_void>::load
            ((type_caster<int,_void> *)this,*(PyObject **)(*(long *)(call + 8) + 0x30),
             SUB41((**(uint **)(call + 0x20) & 0x40) >> 6,0));
  lVar3 = 0;
  do {
    cVar1 = *(char *)((long)&uStack_18 + lVar3 + 1);
    if (cVar1 != '\x01') {
      return (bool)cVar1;
    }
    bVar2 = lVar3 != 6;
    lVar3 = lVar3 + 1;
  } while (bVar2);
  return true;
}

Assistant:

bool load_impl_sequence(function_call &call, index_sequence<Is...>) {
#ifdef __cpp_fold_expressions
        if ((... || !std::get<Is>(argcasters).load(call.args[Is], call.args_convert[Is])))
            return false;
#else
        for (bool r : {std::get<Is>(argcasters).load(call.args[Is], call.args_convert[Is])...})
            if (!r)
                return false;
#endif
        return true;
    }